

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject_p.h
# Opt level: O2

bool comparesEqual(QArgumentType *lhs,QArgumentType *rhs)

{
  QMetaTypeInterface *pQVar1;
  QMetaTypeInterface *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView local_38;
  QByteArrayView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (lhs->_metaType).d_ptr;
  if ((pQVar1 == (QMetaTypeInterface *)0x0) ||
     (pQVar2 = (rhs->_metaType).d_ptr, pQVar2 == (QMetaTypeInterface *)0x0)) {
    local_28 = QArgumentType::name(lhs);
    local_38 = QArgumentType::name(rhs);
    bVar3 = comparesEqual(&local_28,&local_38);
  }
  else {
    local_28.m_data = (storage_type *)local_28.m_size;
    local_28.m_size = (qsizetype)pQVar1;
    local_38.m_data = (storage_type *)local_38.m_size;
    local_38.m_size = (qsizetype)pQVar2;
    bVar3 = comparesEqual((QMetaType *)&local_28,(QMetaType *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QArgumentType &lhs,
                              const QArgumentType &rhs)
    {
        if (lhs.metaType().isValid() && rhs.metaType().isValid())
            return lhs.metaType() == rhs.metaType();
        else
            return lhs.name() == rhs.name();
    }